

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_state_utils.cpp
# Opt level: O2

void Redistribution::MakeStateRedistUtils
               (Box *bx,Array4<const_amrex::EBCellFlag> *flag,Array4<const_double> *vfrac,
               Array4<const_double> *ccent,Array4<const_int> *itracker,Array4<double> *nrs,
               Array4<double> *alpha,Array4<double> *nbhd_vol,Array4<double> *cent_hat,
               Geometry *lev_geom,Real target_vol)

{
  char cVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  double dVar11;
  double dVar12;
  undefined8 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  EBCellFlag *pEVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  undefined4 uVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  undefined4 uVar57;
  undefined4 uVar58;
  bool bVar59;
  int iVar60;
  int iVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  long lVar68;
  int iVar69;
  int iVar70;
  uint uVar71;
  long lVar72;
  long lVar73;
  double *pdVar74;
  int k;
  int iVar75;
  double *pdVar76;
  int *piVar77;
  int iVar78;
  int iVar79;
  ulong uVar80;
  long lVar81;
  long lVar82;
  undefined4 *puVar83;
  int iVar84;
  long lVar85;
  long lVar86;
  long lVar87;
  long lVar88;
  double **ppdVar89;
  undefined8 *puVar90;
  Long *pLVar91;
  IntVect *pIVar92;
  long *plVar93;
  undefined4 *puVar94;
  int *piVar95;
  double *pdVar96;
  long lVar97;
  int *piVar98;
  int iVar99;
  int iVar100;
  double *pdVar101;
  long lVar102;
  int i_nbor;
  long lVar103;
  int iVar104;
  int iVar105;
  int iVar106;
  double *pdVar107;
  int j_1;
  int iVar108;
  int iVar109;
  long lVar110;
  double *pdVar111;
  long lVar112;
  byte bVar113;
  int *local_590;
  int *local_588;
  int *local_580;
  int *local_560;
  int *local_558;
  int *local_508;
  IntVect local_470;
  IntVect local_464;
  ulong local_458;
  int *local_450;
  long local_448;
  Array4<const_amrex::EBCellFlag> *local_440;
  ulong local_438;
  Array4<const_double> *local_430;
  long local_428;
  long local_420;
  long local_418;
  double *local_410;
  long local_408;
  long local_400;
  double *local_3f8;
  long local_3f0;
  long local_3e8;
  EBCellFlag *local_3e0;
  int *local_3d8;
  long local_3d0;
  long local_3c8;
  long local_3c0;
  long local_3b8;
  long local_3b0;
  long local_3a8;
  int local_3a0;
  int local_39c;
  double local_398;
  Array4<const_double> *local_390;
  long local_388;
  long local_380;
  double *local_378;
  Long LStack_370;
  Long local_368;
  Long LStack_360;
  undefined8 local_358;
  int iStack_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined8 uStack_344;
  double *local_338;
  long lStack_330;
  long local_328;
  Long LStack_320;
  undefined8 local_318;
  int iStack_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined8 uStack_304;
  double *local_2f8;
  long lStack_2f0;
  long local_2e8;
  Long LStack_2e0;
  undefined8 local_2d8;
  int iStack_2d0;
  int aiStack_2cc [2];
  undefined8 uStack_2c4;
  double *local_2b8;
  long lStack_2b0;
  long local_2a8;
  Long LStack_2a0;
  undefined8 local_298;
  int iStack_290;
  int aiStack_28c [2];
  undefined8 uStack_284;
  undefined8 local_278;
  undefined8 uStack_270;
  long local_268;
  undefined1 auStack_260 [8];
  undefined8 local_258;
  int iStack_250;
  undefined4 uStack_24c;
  undefined4 local_248;
  uint local_244;
  undefined4 local_240;
  undefined4 uStack_23c;
  Long LStack_238;
  Long local_230;
  Long LStack_228;
  undefined8 local_220;
  int iStack_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined8 uStack_20c;
  int local_200 [3];
  Box local_1f4;
  Box local_1d8;
  double *local_1b8;
  double *pdStack_1b0;
  Long local_1a8;
  Long LStack_1a0;
  undefined8 local_198;
  int iStack_190;
  int iStack_18c;
  int local_188;
  undefined4 local_184;
  undefined4 uStack_180;
  undefined8 uStack_17c;
  double *local_170;
  long lStack_168;
  long local_160;
  Long LStack_158;
  undefined8 local_150;
  int iStack_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined8 uStack_13c;
  int local_128 [14];
  double *local_f0;
  long lStack_e8;
  long local_e0;
  long lStack_d8;
  undefined8 local_d0;
  int iStack_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  Long LStack_b0;
  Long local_a8;
  Long LStack_a0;
  undefined8 local_98;
  int local_90;
  undefined4 local_8c;
  undefined4 uStack_88;
  undefined8 uStack_84;
  double *local_78;
  Long LStack_70;
  Long local_68;
  Long LStack_60;
  undefined8 local_58;
  int iStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  
  bVar113 = 0;
  cVar1 = (lev_geom->super_CoordSys).field_0x51;
  cVar2 = (lev_geom->super_CoordSys).field_0x52;
  iVar79 = (bx->smallend).vect[2];
  iVar75 = (bx->bigend).vect[1];
  local_3a8 = (long)iVar75 + 3;
  iVar69 = iVar79 + -4;
  iVar4 = (lev_geom->domain).bigend.vect[0];
  iVar70 = iVar4 + 2;
  if (cVar1 == '\0') {
    iVar70 = iVar4;
  }
  iVar4 = (lev_geom->domain).smallend.vect[1];
  iVar99 = iVar4 + -2;
  if (cVar2 == '\0') {
    iVar99 = iVar4;
  }
  cVar3 = (lev_geom->super_CoordSys).field_0x53;
  iVar4 = (lev_geom->domain).bigend.vect[2];
  iVar106 = iVar4 + 2;
  if (cVar3 == '\0') {
    iVar106 = iVar4;
  }
  local_448 = (long)(iVar79 + -3);
  uVar71 = (bx->smallend).vect[1];
  local_458 = (ulong)uVar71;
  iVar84 = uVar71 - 3;
  lVar110 = (long)iVar84;
  lVar63 = alpha->kstride;
  lVar72 = (local_448 - (alpha->begin).z) * lVar63;
  lVar62 = alpha->jstride;
  lVar85 = (lVar110 - (alpha->begin).y) * lVar62;
  iVar105 = (bx->smallend).vect[0];
  iVar4 = iVar105 + -3;
  lVar73 = (long)iVar4;
  lVar86 = (long)(alpha->begin).x;
  pdVar96 = alpha->p + ((alpha->nstride + lVar73 + lVar72 + lVar85) - lVar86);
  pdVar76 = alpha->p + ((lVar73 + lVar72 + lVar85) - lVar86);
  lVar85 = nrs->kstride;
  lVar86 = nrs->jstride;
  lVar72 = (long)iVar75 + 2;
  iVar5 = (bx->bigend).vect[0];
  iVar6 = (bx->bigend).vect[2];
  uVar7 = (bx->btype).itype;
  iVar109 = iVar105 + -2;
  iVar108 = (lev_geom->domain).smallend.vect[0];
  iVar8 = (lev_geom->domain).smallend.vect[2];
  uVar9 = (lev_geom->domain).bigend.vect[1];
  uVar10 = (lev_geom->domain).btype.itype;
  pdVar74 = nrs->p + ((lVar73 + (local_448 - (nrs->begin).z) * lVar85 +
                                (lVar110 - (nrs->begin).y) * lVar86) - (long)(nrs->begin).x);
  iVar61 = iVar5 + 3;
  local_3c8 = (long)iVar6 + 3;
  for (lVar73 = local_448; lVar88 = lVar110, pdVar101 = pdVar96, pdVar107 = pdVar74,
      pdVar111 = pdVar76, lVar73 <= local_3c8; lVar73 = lVar73 + 1) {
    for (; lVar88 <= local_3a8; lVar88 = lVar88 + 1) {
      if (iVar4 <= iVar61) {
        lVar87 = 0;
        do {
          pdVar107[lVar87] = 1.0;
          pdVar111[lVar87] = 1.0;
          pdVar101[lVar87] = 1.0;
          lVar87 = lVar87 + 1;
        } while ((iVar5 - iVar105) + 7 != (int)lVar87);
      }
      pdVar101 = pdVar101 + lVar62;
      pdVar107 = pdVar107 + lVar86;
      pdVar111 = pdVar111 + lVar62;
    }
    pdVar96 = pdVar96 + lVar63;
    pdVar76 = pdVar76 + lVar63;
    pdVar74 = pdVar74 + lVar85;
  }
  iVar60 = iVar5 + 2;
  local_39c = iVar108 + -2;
  if (cVar1 == '\0') {
    local_39c = iVar108;
  }
  if (cVar2 != '\0') {
    uVar9 = uVar9 + 2;
  }
  local_438 = (ulong)uVar9;
  local_3a0 = iVar8 + -2;
  if (cVar3 == '\0') {
    local_3a0 = iVar8;
  }
  local_378 = (double *)itracker->p;
  LStack_370 = itracker->jstride;
  local_368 = itracker->kstride;
  LStack_360 = itracker->nstride;
  local_358._0_4_ = (itracker->begin).x;
  local_358._4_4_ = (itracker->begin).y;
  uVar13 = *(undefined8 *)&(itracker->begin).z;
  uVar14 = (itracker->end).y;
  uStack_344 = *(undefined8 *)&(itracker->end).z;
  iStack_350 = (int)uVar13;
  uStack_34c = (undefined4)((ulong)uVar13 >> 0x20);
  lVar63 = 0x1b;
  puVar83 = &DAT_0060b2a0;
  ppdVar89 = &local_338;
  for (lVar62 = lVar63; lVar62 != 0; lVar62 = lVar62 + -1) {
    *(undefined4 *)ppdVar89 = *puVar83;
    puVar83 = puVar83 + 1;
    ppdVar89 = (double **)((long)ppdVar89 + 4);
  }
  piVar77 = &DAT_0060b30c;
  piVar95 = aiStack_2cc;
  for (lVar62 = lVar63; lVar62 != 0; lVar62 = lVar62 + -1) {
    *piVar95 = *piVar77;
    piVar77 = piVar77 + 1;
    piVar95 = piVar95 + 1;
  }
  puVar83 = &DAT_0060b378;
  puVar94 = (undefined4 *)auStack_260;
  for (; lVar63 != 0; lVar63 = lVar63 + -1) {
    *puVar94 = *puVar83;
    puVar83 = puVar83 + 1;
    puVar94 = puVar94 + 1;
  }
  local_1f4.smallend.vect[0] = local_39c;
  local_1f4.smallend.vect[1] = iVar99;
  local_1f4.smallend.vect[2] = local_3a0;
  local_1f4.bigend.vect[0] = iVar70;
  local_1f4.bigend.vect[1] = uVar9;
  local_1f4.bigend.vect[2] = iVar106;
  local_1f4.btype.itype = uVar10;
  local_1d8.smallend.vect[0] = iVar4;
  local_1d8.smallend.vect[1] = iVar84;
  local_1d8.smallend.vect[2] = iVar79 + -3;
  local_1d8.bigend.vect[0] = iVar61;
  local_1d8.bigend.vect[1] = (int)local_3a8;
  local_1d8.bigend.vect[2] = (int)local_3c8;
  local_1d8.btype.itype = uVar7;
  uVar15 = (nrs->end).x;
  uVar16 = (nrs->end).y;
  uVar13 = *(undefined8 *)&(nrs->end).z;
  local_1b8 = nrs->p;
  pdStack_1b0 = (double *)nrs->jstride;
  local_1a8 = nrs->kstride;
  LStack_1a0 = nrs->nstride;
  local_198._0_4_ = (nrs->begin).x;
  local_198._4_4_ = (nrs->begin).y;
  iStack_190 = (int)*(undefined8 *)&(nrs->begin).z;
  iStack_18c = uVar15;
  local_188 = uVar16;
  local_184 = (undefined4)uVar13;
  uStack_180 = (undefined4)((ulong)uVar13 >> 0x20);
  local_440 = flag;
  local_430 = vfrac;
  local_398 = target_vol;
  local_390 = ccent;
  uStack_348 = uVar14;
  for (; iVar108 = uVar71 - 4, iVar69 <= iVar6 + 4; iVar69 = iVar69 + 1) {
    for (; iVar108 <= iVar75 + 4; iVar108 = iVar108 + 1) {
      iVar8 = iVar105 + -4;
      if (iVar105 + -4 <= iVar5 + 4) {
        do {
          lVar63 = 1;
          while( true ) {
            lVar85 = ((long)iVar108 - (long)local_358._4_4_) * LStack_370;
            lVar62 = ((long)iVar69 - (long)iStack_350) * local_368;
            lVar86 = (long)iVar8 - (long)(int)local_358;
            if (*(int *)((long)local_378 + (lVar85 + lVar86 + lVar62) * 4) < lVar63) break;
            lVar85 = (long)*(int *)((long)local_378 +
                                   (lVar85 + lVar86 + lVar62 + LStack_360 * lVar63) * 4);
            lVar86 = (long)*(int *)((long)&local_338 + lVar85 * 4) + (long)iVar8;
            lVar62 = (long)aiStack_2cc[lVar85] + (long)iVar108;
            lVar85 = (long)*(int *)(auStack_260 + lVar85 * 4) + (long)iVar69;
            iVar104 = (int)lVar86;
            iVar78 = (int)lVar62;
            iVar100 = (int)lVar85;
            local_470.vect[0] = iVar104;
            local_470.vect[1] = iVar78;
            local_470.vect[2] = iVar100;
            bVar59 = amrex::Box::contains(&local_1f4,&local_470);
            if ((bVar59) &&
               (local_464.vect[0] = iVar104, local_464.vect[1] = iVar78, local_464.vect[2] = iVar100
               , bVar59 = amrex::Box::contains(&local_1d8,&local_464), bVar59)) {
              lVar62 = (lVar62 - local_198._4_4_) * (long)pdStack_1b0;
              lVar85 = (lVar85 - iStack_190) * local_1a8;
              lVar86 = lVar86 - (int)local_198;
              local_1b8[lVar62 + lVar86 + lVar85] = local_1b8[lVar62 + lVar86 + lVar85] + 1.0;
            }
            lVar63 = lVar63 + 1;
          }
          bVar59 = iVar8 != iVar5 + 4;
          iVar8 = iVar8 + 1;
        } while (bVar59);
      }
    }
  }
  uVar71 = (int)local_458 - 2;
  local_458 = (ulong)uVar71;
  lVar63 = (long)iVar6 + 2;
  pEVar17 = local_440->p;
  lVar85 = local_440->jstride;
  lVar86 = local_440->kstride;
  uVar18 = (local_440->begin).x;
  uVar19 = (local_440->begin).y;
  iStack_350 = (int)*(undefined8 *)&(local_440->begin).z;
  local_338 = nbhd_vol->p;
  lStack_330 = nbhd_vol->jstride;
  local_328 = nbhd_vol->kstride;
  local_318._0_4_ = (nbhd_vol->begin).x;
  local_318._4_4_ = (nbhd_vol->begin).y;
  uVar13 = *(undefined8 *)&(nbhd_vol->begin).z;
  uVar20 = (nbhd_vol->end).y;
  uStack_308 = uVar20;
  uStack_304 = *(undefined8 *)&(nbhd_vol->end).z;
  iStack_310 = (int)uVar13;
  uStack_30c = (undefined4)((ulong)uVar13 >> 0x20);
  LStack_320 = nbhd_vol->nstride;
  local_2f8 = local_430->p;
  lStack_2f0 = local_430->jstride;
  local_2e8 = local_430->kstride;
  local_2d8._0_4_ = (local_430->begin).x;
  local_2d8._4_4_ = (local_430->begin).y;
  uVar21 = (local_430->end).x;
  uVar22 = (local_430->end).y;
  LStack_2e0 = local_430->nstride;
  iStack_2d0 = (int)*(undefined8 *)&(local_430->begin).z;
  aiStack_2cc[0] = uVar21;
  aiStack_2cc[1] = uVar22;
  uStack_2c4 = *(undefined8 *)&(local_430->end).z;
  local_2b8 = nrs->p;
  lStack_2b0 = nrs->jstride;
  local_2a8 = nrs->kstride;
  local_298._0_4_ = (nrs->begin).x;
  local_298._4_4_ = (nrs->begin).y;
  uVar23 = (nrs->end).x;
  uVar24 = (nrs->end).y;
  LStack_2a0 = nrs->nstride;
  iStack_290 = (int)*(undefined8 *)&(nrs->begin).z;
  aiStack_28c[0] = uVar23;
  aiStack_28c[1] = uVar24;
  uStack_284 = *(undefined8 *)&(nrs->end).z;
  local_278 = itracker->p;
  uStack_270 = itracker->jstride;
  local_268 = itracker->kstride;
  auStack_260 = (undefined1  [8])itracker->nstride;
  local_258._0_4_ = (itracker->begin).x;
  local_258._4_4_ = (itracker->begin).y;
  uVar25 = (itracker->end).x;
  uVar26 = (itracker->end).y;
  uVar13 = *(undefined8 *)&(itracker->end).z;
  iStack_250 = (int)*(undefined8 *)&(itracker->begin).z;
  uStack_24c = uVar25;
  local_248 = uVar26;
  local_244 = (uint)uVar13;
  local_240 = (undefined4)((ulong)uVar13 >> 0x20);
  lVar62 = 0x1b;
  puVar83 = &DAT_0060b2a0;
  pLVar91 = &LStack_238;
  for (lVar73 = lVar62; lVar73 != 0; lVar73 = lVar73 + -1) {
    *(undefined4 *)pLVar91 = *puVar83;
    puVar83 = puVar83 + (ulong)bVar113 * -2 + 1;
    pLVar91 = (Long *)((long)pLVar91 + (ulong)bVar113 * -8 + 4);
  }
  piVar77 = &DAT_0060b30c;
  pIVar92 = &local_1d8.bigend;
  for (lVar73 = lVar62; lVar73 != 0; lVar73 = lVar73 + -1) {
    pIVar92->vect[0] = *piVar77;
    piVar77 = piVar77 + (ulong)bVar113 * -2 + 1;
    pIVar92 = (IntVect *)((long)pIVar92 + ((ulong)bVar113 * -2 + 1) * 4);
  }
  puVar83 = &DAT_0060b378;
  plVar93 = &local_160;
  for (; lVar62 != 0; lVar62 = lVar62 + -1) {
    *(undefined4 *)plVar93 = *puVar83;
    puVar83 = puVar83 + (ulong)bVar113 * -2 + 1;
    plVar93 = (long *)((long)plVar93 + (ulong)bVar113 * -8 + 4);
  }
  local_f0 = alpha->p;
  lStack_e8 = alpha->jstride;
  local_380 = alpha->kstride;
  lStack_d8 = alpha->nstride;
  local_d0._0_4_ = (alpha->begin).x;
  local_d0._4_4_ = (alpha->begin).y;
  uVar27 = (alpha->end).x;
  uVar28 = (alpha->end).y;
  uVar13 = *(undefined8 *)&(alpha->end).z;
  iStack_c8 = (int)*(undefined8 *)&(alpha->begin).z;
  local_e0 = local_380;
  uStack_c4 = uVar27;
  uStack_c0 = uVar28;
  uStack_bc = (undefined4)uVar13;
  local_b8 = (undefined4)((ulong)uVar13 >> 0x20);
  lVar110 = (long)iVar109;
  lVar73 = (long)(int)uVar71;
  lVar88 = (long)(iVar79 + -2);
  piVar77 = local_278 +
            ((lVar110 +
             (long)auStack_260 +
             (lVar73 - (int)local_258._4_4_) * uStack_270 + (lVar88 - iStack_250) * local_268) -
            (long)(int)(undefined4)local_258);
  local_388 = local_268 * 4;
  for (lVar62 = lVar88; lVar62 <= lVar63; lVar62 = lVar62 + 1) {
    lVar64 = (lVar62 - iStack_2d0) * local_2e8;
    lVar65 = (lVar62 - iStack_310) * local_328;
    lVar66 = (lVar62 - iStack_c8) * local_380;
    local_558 = piVar77;
    for (lVar87 = lVar73; lVar87 <= lVar72; lVar87 = lVar87 + 1) {
      if (iVar109 <= iVar60) {
        lVar67 = (lVar87 - local_2d8._4_4_) * lStack_2f0;
        lVar68 = (lVar87 - local_318._4_4_) * lStack_330;
        lVar81 = (lVar87 - (int)local_d0._4_4_) * lStack_e8;
        lVar82 = lVar110;
        piVar95 = local_558;
        do {
          if ((~pEVar17[(lVar62 - iStack_350) * lVar86 +
                        (lVar87 - (int)uVar19) * lVar85 + (lVar82 - (int)uVar18)].flag & 3) == 0) {
            local_338[lVar65 + lVar68 + (lVar82 - (int)local_318)] = 0.0;
            local_f0[lVar66 + lVar81 + (lVar82 - (int)(undefined4)local_d0)] = 0.0;
            (local_f0 + lVar66 + lVar81 + (lVar82 - (int)(undefined4)local_d0))[lStack_d8] = 0.0;
          }
          else {
            dVar11 = local_2f8[lVar64 + lVar67 + (lVar82 - (int)local_2d8)] /
                     local_2b8[(lVar62 - iStack_290) * local_2a8 +
                               (lVar87 - local_298._4_4_) * lStack_2b0 + (lVar82 - (int)local_298)];
            lVar103 = lVar82 - (int)local_318;
            local_338[lVar65 + lVar68 + lVar103] = dVar11;
            uVar9 = local_278[(lVar62 - iStack_250) * local_268 +
                              (lVar87 - (int)local_258._4_4_) * uStack_270 +
                              (lVar82 - (int)(undefined4)local_258)];
            uVar80 = 0;
            if (0 < (int)uVar9) {
              uVar80 = (ulong)uVar9;
            }
            dVar12 = 0.0;
            piVar98 = piVar95;
            while (bVar59 = uVar80 != 0, uVar80 = uVar80 - 1, bVar59) {
              lVar102 = (long)*piVar98;
              iVar75 = *(int *)((long)&LStack_238 + lVar102 * 4) + (int)lVar82;
              iVar105 = local_1d8.bigend.vect[lVar102] + (int)lVar87;
              lVar112 = (long)(iVar75 - (int)local_2d8);
              lVar97 = (iVar105 - local_2d8._4_4_) * lStack_2f0;
              iVar69 = *(int *)((long)&local_160 + lVar102 * 4) + (int)lVar62;
              lVar102 = (iVar69 - iStack_2d0) * local_2e8;
              dVar11 = dVar11 + local_2f8[lVar97 + lVar112 + lVar102] /
                                local_2b8[(iVar105 - local_298._4_4_) * lStack_2b0 +
                                          (long)(iVar75 - (int)local_298) +
                                          (iVar69 - iStack_290) * local_2a8];
              local_338[lVar65 + lVar68 + lVar103] = dVar11;
              dVar12 = dVar12 + local_2f8[lVar97 + lVar112 + lVar102];
              piVar98 = piVar98 + (long)auStack_260;
            }
            if (0 < (int)uVar9) {
              local_f0[lVar66 + lVar81 + lStack_d8 + (lVar82 - (int)(undefined4)local_d0)] =
                   (local_398 - local_2f8[lVar64 + lVar67 + (lVar82 - (int)local_2d8)]) / dVar12;
            }
          }
          lVar82 = lVar82 + 1;
          piVar95 = piVar95 + 1;
        } while (iVar61 != (int)lVar82);
      }
      local_558 = local_558 + uStack_270;
    }
    piVar77 = piVar77 + local_268;
  }
  pEVar17 = local_440->p;
  lVar85 = local_440->jstride;
  lVar86 = local_440->kstride;
  uVar29 = (local_440->begin).x;
  uVar30 = (local_440->begin).y;
  iStack_350 = (int)*(undefined8 *)&(local_440->begin).z;
  local_338 = (double *)itracker->p;
  lStack_330 = itracker->jstride;
  local_328 = itracker->kstride;
  LStack_320 = itracker->nstride;
  local_318._0_4_ = (itracker->begin).x;
  local_318._4_4_ = (itracker->begin).y;
  uVar31 = (itracker->end).x;
  uVar32 = (itracker->end).y;
  iStack_310 = (int)*(undefined8 *)&(itracker->begin).z;
  uStack_30c = uVar31;
  uStack_308 = uVar32;
  uStack_304 = *(undefined8 *)&(itracker->end).z;
  lVar62 = 0x1b;
  puVar83 = &DAT_0060b2a0;
  ppdVar89 = &local_2f8;
  for (lVar87 = lVar62; lVar87 != 0; lVar87 = lVar87 + -1) {
    *(undefined4 *)ppdVar89 = *puVar83;
    puVar83 = puVar83 + (ulong)bVar113 * -2 + 1;
    ppdVar89 = (double **)((long)ppdVar89 + (ulong)bVar113 * -8 + 4);
  }
  piVar77 = &DAT_0060b30c;
  piVar95 = aiStack_28c;
  for (lVar87 = lVar62; lVar87 != 0; lVar87 = lVar87 + -1) {
    *piVar95 = *piVar77;
    piVar77 = piVar77 + (ulong)bVar113 * -2 + 1;
    piVar95 = piVar95 + (ulong)bVar113 * -2 + 1;
  }
  puVar83 = &DAT_0060b378;
  puVar90 = &local_220;
  for (; lVar62 != 0; lVar62 = lVar62 + -1) {
    *(undefined4 *)puVar90 = *puVar83;
    puVar83 = puVar83 + (ulong)bVar113 * -2 + 1;
    puVar90 = (undefined8 *)((long)puVar90 + (ulong)bVar113 * -8 + 4);
  }
  pdStack_1b0 = alpha->p;
  local_1a8 = alpha->jstride;
  LStack_1a0 = alpha->kstride;
  local_198 = alpha->nstride;
  uVar33 = (alpha->begin).x;
  uVar34 = (alpha->begin).y;
  uVar13 = *(undefined8 *)&(alpha->begin).z;
  uVar35 = (alpha->end).y;
  uStack_180 = uVar35;
  uStack_17c = *(undefined8 *)&(alpha->end).z;
  iStack_190 = uVar33;
  iStack_18c = uVar34;
  local_188 = (int)uVar13;
  local_184 = (undefined4)((ulong)uVar13 >> 0x20);
  local_170 = nrs->p;
  lStack_168 = nrs->jstride;
  local_160 = nrs->kstride;
  local_150._0_4_ = (nrs->begin).x;
  local_150._4_4_ = (nrs->begin).y;
  uVar36 = (nrs->end).x;
  uVar37 = (nrs->end).y;
  iStack_148 = (int)*(undefined8 *)&(nrs->begin).z;
  LStack_158 = nrs->nstride;
  uStack_144 = uVar36;
  uStack_140 = uVar37;
  uStack_13c = *(undefined8 *)&(nrs->end).z;
  local_508 = (int *)((long)local_338 +
                     ((lVar110 +
                      LStack_320 +
                      (lVar73 - local_318._4_4_) * lStack_330 + (lVar88 - iStack_310) * local_328) -
                     (long)(int)local_318) * 4);
  for (lVar62 = lVar88; lVar62 <= lVar63; lVar62 = lVar62 + 1) {
    local_588 = local_508;
    for (lVar87 = lVar73; lVar87 <= lVar72; lVar87 = lVar87 + 1) {
      if (iVar109 <= iVar60) {
        local_560 = local_588;
        lVar64 = lVar110;
        do {
          if ((~pEVar17[(lVar62 - iStack_350) * lVar86 +
                        (lVar87 - (int)uVar30) * lVar85 + (lVar64 - (int)uVar29)].flag & 3) != 0) {
            uVar9 = *(uint *)((long)local_338 +
                             ((lVar62 - iStack_310) * local_328 +
                             (lVar87 - local_318._4_4_) * lStack_330 + (lVar64 - (int)local_318)) *
                             4);
            if ((int)uVar9 < 1) {
              uVar9 = 0;
            }
            uVar80 = (ulong)uVar9;
            piVar77 = local_560;
            while (bVar59 = uVar80 != 0, uVar80 = uVar80 - 1, bVar59) {
              lVar65 = (long)*piVar77;
              lVar82 = (long)*(int *)((long)&local_2f8 + lVar65 * 4) + (long)(int)lVar64;
              lVar81 = (long)aiStack_28c[lVar65] + (long)(int)lVar87;
              lVar65 = (long)*(int *)((long)&local_220 + lVar65 * 4) + (long)(int)lVar62;
              lVar66 = (long)((int)lVar82 - iStack_190);
              lVar67 = ((int)lVar81 - iStack_18c) * local_1a8;
              lVar68 = ((int)lVar65 - local_188) * LStack_1a0;
              pdStack_1b0[lVar67 + lVar66 + lVar68] =
                   pdStack_1b0[lVar67 + lVar66 + lVar68] -
                   pdStack_1b0
                   [local_198 +
                    (lVar62 - local_188) * LStack_1a0 +
                    (lVar87 - iStack_18c) * local_1a8 + (lVar64 - iStack_190)] /
                   local_170[(lVar81 - (int)local_150._4_4_) * lStack_168 +
                             (lVar82 - (int)(undefined4)local_150) +
                             (lVar65 - iStack_148) * local_160];
              piVar77 = piVar77 + LStack_320;
            }
          }
          lVar64 = lVar64 + 1;
          local_560 = local_560 + 1;
        } while (iVar61 != (int)lVar64);
      }
      local_588 = local_588 + lStack_330;
    }
    local_508 = local_508 + local_328;
  }
  local_3e0 = local_440->p;
  lVar85 = local_440->jstride;
  local_3f0 = local_440->kstride;
  uVar38 = (local_440->begin).x;
  uVar39 = (local_440->begin).y;
  iStack_350 = (int)*(undefined8 *)&(local_440->begin).z;
  local_410 = nbhd_vol->p;
  local_3b8 = nbhd_vol->jstride;
  local_420 = nbhd_vol->kstride;
  local_318._0_4_ = (nbhd_vol->begin).x;
  local_318._4_4_ = (nbhd_vol->begin).y;
  uVar13 = *(undefined8 *)&(nbhd_vol->begin).z;
  uVar40 = (nbhd_vol->end).y;
  uStack_308 = uVar40;
  uStack_304 = *(undefined8 *)&(nbhd_vol->end).z;
  iStack_310 = (int)uVar13;
  uStack_30c = (undefined4)((ulong)uVar13 >> 0x20);
  local_328 = local_420;
  LStack_320 = nbhd_vol->nstride;
  local_338 = local_410;
  lStack_330 = local_3b8;
  local_3f8 = alpha->p;
  lStack_2f0 = alpha->jstride;
  local_408 = alpha->kstride;
  LStack_2e0 = alpha->nstride;
  local_2d8._0_4_ = (alpha->begin).x;
  local_2d8._4_4_ = (alpha->begin).y;
  uVar41 = (alpha->end).x;
  uVar42 = (alpha->end).y;
  local_2f8 = local_3f8;
  local_2e8 = local_408;
  iStack_2d0 = (int)*(undefined8 *)&(alpha->begin).z;
  aiStack_2cc[0] = uVar41;
  aiStack_2cc[1] = uVar42;
  uStack_2c4 = *(undefined8 *)&(alpha->end).z;
  local_2b8 = local_430->p;
  lStack_2b0 = local_430->jstride;
  local_2a8 = local_430->kstride;
  local_298._0_4_ = (local_430->begin).x;
  local_298._4_4_ = (local_430->begin).y;
  uVar43 = (local_430->end).x;
  uVar44 = (local_430->end).y;
  LStack_2a0 = local_430->nstride;
  iStack_290 = (int)*(undefined8 *)&(local_430->begin).z;
  aiStack_28c[0] = uVar43;
  aiStack_28c[1] = uVar44;
  uStack_284 = *(undefined8 *)&(local_430->end).z;
  local_3d8 = itracker->p;
  uStack_270 = itracker->jstride;
  local_3d0 = itracker->kstride;
  auStack_260 = (undefined1  [8])itracker->nstride;
  local_258._0_4_ = (itracker->begin).x;
  local_258._4_4_ = (itracker->begin).y;
  uVar45 = (itracker->end).x;
  uVar46 = (itracker->end).y;
  uVar13 = *(undefined8 *)&(itracker->end).z;
  local_278 = local_3d8;
  local_268 = local_3d0;
  iStack_250 = (int)*(undefined8 *)&(itracker->begin).z;
  uStack_24c = uVar45;
  local_248 = uVar46;
  local_244 = (uint)uVar13;
  local_240 = (undefined4)((ulong)uVar13 >> 0x20);
  lVar62 = 0x1b;
  puVar83 = &DAT_0060b2a0;
  pLVar91 = &LStack_238;
  for (lVar86 = lVar62; lVar86 != 0; lVar86 = lVar86 + -1) {
    *(undefined4 *)pLVar91 = *puVar83;
    puVar83 = puVar83 + (ulong)bVar113 * -2 + 1;
    pLVar91 = (Long *)((long)pLVar91 + (ulong)bVar113 * -8 + 4);
  }
  piVar77 = &DAT_0060b30c;
  pIVar92 = &local_1d8.bigend;
  for (lVar86 = lVar62; lVar86 != 0; lVar86 = lVar86 + -1) {
    pIVar92->vect[0] = *piVar77;
    piVar77 = piVar77 + (ulong)bVar113 * -2 + 1;
    pIVar92 = (IntVect *)((long)pIVar92 + ((ulong)bVar113 * -2 + 1) * 4);
  }
  puVar83 = &DAT_0060b378;
  plVar93 = &local_160;
  for (; lVar62 != 0; lVar62 = lVar62 + -1) {
    *(undefined4 *)plVar93 = *puVar83;
    puVar83 = puVar83 + (ulong)bVar113 * -2 + 1;
    plVar93 = (long *)((long)plVar93 + (ulong)bVar113 * -8 + 4);
  }
  local_f0 = nrs->p;
  lStack_e8 = nrs->jstride;
  local_e0 = nrs->kstride;
  local_d0._0_4_ = (nrs->begin).x;
  local_d0._4_4_ = (nrs->begin).y;
  uVar47 = (nrs->end).x;
  uVar48 = (nrs->end).y;
  uVar13 = *(undefined8 *)&(nrs->end).z;
  iStack_c8 = (int)*(undefined8 *)&(nrs->begin).z;
  lStack_d8 = nrs->nstride;
  uStack_c4 = uVar47;
  uStack_c0 = uVar48;
  uStack_bc = (undefined4)uVar13;
  local_b8 = (undefined4)((ulong)uVar13 >> 0x20);
  local_3c0 = (long)iStack_250;
  local_3e8 = (long)iStack_350;
  local_400 = (long)iStack_2d0;
  local_3b0 = (long)local_318._4_4_;
  local_418 = (long)iStack_310;
  local_450 = local_3d8 +
              ((lVar110 +
               (long)auStack_260 +
               (lVar73 - (int)local_258._4_4_) * uStack_270 + (lVar88 - local_3c0) * local_3d0) -
              (long)(int)(undefined4)local_258);
  local_428 = local_3d0 * 4;
  for (; lVar88 <= lVar63; lVar88 = lVar88 + 1) {
    lVar86 = (lVar88 - local_418) * local_420;
    local_590 = local_450;
    for (lVar62 = lVar73; lVar62 <= lVar72; lVar62 = lVar62 + 1) {
      if (iVar109 <= iVar60) {
        lVar64 = (lVar62 - local_3b0) * local_3b8;
        local_580 = local_590;
        lVar87 = lVar110;
        do {
          if ((~local_3e0[(lVar88 - local_3e8) * local_3f0 +
                          (lVar62 - (int)uVar39) * lVar85 + (lVar87 - (int)uVar38)].flag & 3) != 0)
          {
            dVar11 = local_3f8[(lVar88 - local_400) * local_408 +
                               (lVar62 - local_2d8._4_4_) * lStack_2f0 + (lVar87 - (int)local_2d8)]
                     * local_2b8[(lVar88 - iStack_290) * local_2a8 +
                                 (lVar62 - local_298._4_4_) * lStack_2b0 + (lVar87 - (int)local_298)
                                ];
            local_410[lVar86 + lVar64 + (lVar87 - (int)local_318)] = dVar11;
            uVar9 = local_3d8[(lVar88 - local_3c0) * local_3d0 +
                              (lVar62 - (int)local_258._4_4_) * uStack_270 +
                              (lVar87 - (int)(undefined4)local_258)];
            if (local_3d8[(lVar88 - local_3c0) * local_3d0 +
                          (lVar62 - (int)local_258._4_4_) * uStack_270 +
                          (lVar87 - (int)(undefined4)local_258)] < 1) {
              uVar9 = 0;
            }
            uVar80 = (ulong)uVar9;
            piVar77 = local_580;
            while (bVar59 = uVar80 != 0, uVar80 = uVar80 - 1, bVar59) {
              lVar82 = (long)*piVar77;
              lVar66 = (long)*(int *)((long)&LStack_238 + lVar82 * 4) + (long)(int)lVar87;
              lVar65 = (long)local_1d8.bigend.vect[lVar82] + (long)(int)lVar62;
              lVar82 = (long)*(int *)((long)&local_160 + lVar82 * 4) + (long)(int)lVar88;
              dVar11 = dVar11 + ((local_3f8 +
                                 (lVar88 - local_400) * local_408 +
                                 (lVar62 - local_2d8._4_4_) * lStack_2f0 + (lVar87 - (int)local_2d8)
                                 )[LStack_2e0] *
                                local_2b8[((int)lVar65 - local_298._4_4_) * lStack_2b0 +
                                          (long)((int)lVar66 - (int)local_298) +
                                          ((int)lVar82 - iStack_290) * local_2a8]) /
                                local_f0[(lVar65 - (int)local_d0._4_4_) * lStack_e8 +
                                         (lVar66 - (int)(undefined4)local_d0) +
                                         (lVar82 - iStack_c8) * local_e0];
              local_410[lVar86 + lVar64 + (lVar87 - (int)local_318)] = dVar11;
              piVar77 = piVar77 + (long)auStack_260;
            }
          }
          lVar87 = lVar87 + 1;
          local_580 = local_580 + 1;
        } while (iVar61 != (int)lVar87);
      }
      local_590 = local_590 + uStack_270;
    }
    local_450 = local_450 + local_3d0;
  }
  local_378 = local_430->p;
  LStack_370 = local_430->jstride;
  local_368 = local_430->kstride;
  LStack_360 = local_430->nstride;
  local_358._0_4_ = (local_430->begin).x;
  local_358._4_4_ = (local_430->begin).y;
  uVar13 = *(undefined8 *)&(local_430->begin).z;
  uVar49 = (local_430->end).y;
  uStack_344 = *(undefined8 *)&(local_430->end).z;
  iStack_350 = (int)uVar13;
  uStack_34c = (undefined4)((ulong)uVar13 >> 0x20);
  local_338 = cent_hat->p;
  lStack_330 = cent_hat->jstride;
  local_328 = cent_hat->kstride;
  LStack_320 = cent_hat->nstride;
  local_318._0_4_ = (cent_hat->begin).x;
  local_318._4_4_ = (cent_hat->begin).y;
  uVar13 = *(undefined8 *)&(cent_hat->begin).z;
  uVar50 = (cent_hat->end).y;
  uStack_304 = *(undefined8 *)&(cent_hat->end).z;
  iStack_310 = (int)uVar13;
  uStack_30c = (undefined4)((ulong)uVar13 >> 0x20);
  local_2f8 = local_390->p;
  lStack_2f0 = local_390->jstride;
  local_2e8 = local_390->kstride;
  LStack_2e0 = local_390->nstride;
  local_2d8._0_4_ = (local_390->begin).x;
  local_2d8._4_4_ = (local_390->begin).y;
  uVar51 = (local_390->end).x;
  uVar52 = (local_390->end).y;
  uStack_2c4 = *(undefined8 *)&(local_390->end).z;
  iStack_2d0 = (int)*(undefined8 *)&(local_390->begin).z;
  local_2b8 = (double *)itracker->p;
  lStack_2b0 = itracker->jstride;
  local_2a8 = itracker->kstride;
  LStack_2a0 = itracker->nstride;
  local_298._0_4_ = (itracker->begin).x;
  local_298._4_4_ = (itracker->begin).y;
  uVar53 = (itracker->end).x;
  uVar54 = (itracker->end).y;
  uStack_284 = *(undefined8 *)&(itracker->end).z;
  iStack_290 = (int)*(undefined8 *)&(itracker->begin).z;
  local_278._4_4_ = iVar99;
  local_278._0_4_ = local_39c;
  uStack_270._4_4_ = iVar70;
  uStack_270._0_4_ = local_3a0;
  local_268._4_4_ = iVar106;
  local_268._0_4_ = (int)local_438;
  auStack_260._4_4_ = iVar109;
  auStack_260._0_4_ = uVar10;
  local_258 = CONCAT44(iVar79 + -2,uVar71);
  uStack_24c = (undefined4)lVar72;
  local_248 = (undefined4)lVar63;
  LStack_238 = alpha->jstride;
  local_230 = alpha->kstride;
  LStack_228 = alpha->nstride;
  local_220._0_4_ = (alpha->begin).x;
  local_220._4_4_ = (alpha->begin).y;
  uVar13 = *(undefined8 *)&(alpha->begin).z;
  uVar55 = (alpha->end).y;
  uStack_20c = *(undefined8 *)&(alpha->end).z;
  iStack_218 = (int)uVar13;
  uStack_214 = (undefined4)((ulong)uVar13 >> 0x20);
  local_240 = SUB84(alpha->p,0);
  uStack_23c = (undefined4)((ulong)alpha->p >> 0x20);
  lVar72 = 0x1b;
  piVar77 = &DAT_0060b2a0;
  piVar95 = local_200;
  for (lVar63 = lVar72; lVar63 != 0; lVar63 = lVar63 + -1) {
    *piVar95 = *piVar77;
    piVar77 = piVar77 + (ulong)bVar113 * -2 + 1;
    piVar95 = piVar95 + (ulong)bVar113 * -2 + 1;
  }
  puVar83 = &DAT_0060b30c;
  puVar94 = (undefined4 *)((long)&local_198 + 4);
  for (lVar63 = lVar72; lVar63 != 0; lVar63 = lVar63 + -1) {
    *puVar94 = *puVar83;
    puVar83 = puVar83 + (ulong)bVar113 * -2 + 1;
    puVar94 = puVar94 + (ulong)bVar113 * -2 + 1;
  }
  piVar77 = &DAT_0060b378;
  piVar95 = local_128;
  for (; lVar72 != 0; lVar72 = lVar72 + -1) {
    *piVar95 = *piVar77;
    piVar77 = piVar77 + (ulong)bVar113 * -2 + 1;
    piVar95 = piVar95 + (ulong)bVar113 * -2 + 1;
  }
  LStack_b0 = nrs->jstride;
  local_a8 = nrs->kstride;
  LStack_a0 = nrs->nstride;
  local_98._0_4_ = (nrs->begin).x;
  local_98._4_4_ = (nrs->begin).y;
  uVar13 = *(undefined8 *)&(nrs->begin).z;
  uVar56 = (nrs->end).y;
  uStack_84 = *(undefined8 *)&(nrs->end).z;
  local_90 = (int)uVar13;
  local_8c = (undefined4)((ulong)uVar13 >> 0x20);
  local_b8 = SUB84(nrs->p,0);
  uStack_b4 = (undefined4)((ulong)nrs->p >> 0x20);
  local_78 = nbhd_vol->p;
  LStack_70 = nbhd_vol->jstride;
  local_68 = nbhd_vol->kstride;
  LStack_60 = nbhd_vol->nstride;
  local_58._0_4_ = (nbhd_vol->begin).x;
  local_58._4_4_ = (nbhd_vol->begin).y;
  uVar57 = (nbhd_vol->end).x;
  uVar58 = (nbhd_vol->end).y;
  uStack_44 = *(undefined8 *)&(nbhd_vol->end).z;
  iStack_50 = (int)*(undefined8 *)&(nbhd_vol->begin).z;
  uStack_348 = uVar49;
  uStack_308 = uVar50;
  aiStack_2cc[0] = uVar51;
  aiStack_2cc[1] = uVar52;
  aiStack_28c[0] = uVar53;
  aiStack_28c[1] = uVar54;
  iStack_250 = iVar60;
  local_244 = uVar7;
  uStack_210 = uVar55;
  uStack_88 = uVar56;
  uStack_4c = uVar57;
  uStack_48 = uVar58;
  for (lVar72 = local_448; lVar63 = (long)iVar84, local_448 = lVar72, (int)lVar72 <= (int)local_3c8;
      lVar72 = lVar72 + 1) {
    while( true ) {
      iVar79 = (int)lVar63;
      if ((int)local_3a8 < iVar79) break;
      iVar75 = iVar4;
      if (iVar4 <= iVar61) {
        do {
          lVar62 = (long)iVar75;
          lVar86 = (long)iVar79;
          iVar69 = (int)lVar72;
          lVar85 = (long)iVar69;
          if (local_378[(lVar86 - local_358._4_4_) * LStack_370 +
                        (lVar62 - (int)local_358) + (lVar85 - iStack_350) * local_368] <= 0.0) {
            lVar86 = (lVar86 - local_318._4_4_) * lStack_330;
            lVar85 = (lVar85 - iStack_310) * local_328;
            lVar62 = lVar62 - (int)local_318;
            local_338[lVar86 + lVar62 + lVar85] = 1e+40;
            local_338[lVar86 + lVar62 + lVar85 + LStack_320] = 1e+40;
            local_338[lVar86 + lVar62 + lVar85 + LStack_320 * 2] = 1e+40;
          }
          else {
            lVar73 = lVar62 - (int)local_2d8;
            lVar110 = (lVar86 - local_2d8._4_4_) * lStack_2f0;
            lVar87 = (lVar85 - iStack_2d0) * local_2e8;
            lVar88 = lVar62 - (int)local_318;
            lVar64 = (lVar86 - local_318._4_4_) * lStack_330;
            lVar65 = (lVar85 - iStack_310) * local_328;
            local_338[lVar64 + lVar88 + lVar65] = local_2f8[lVar110 + lVar73 + lVar87];
            local_338[lVar64 + lVar88 + lVar65 + LStack_320] =
                 local_2f8[lVar110 + lVar73 + lVar87 + LStack_2e0];
            local_338[lVar64 + lVar88 + lVar65 + LStack_320 * 2] =
                 local_2f8[lVar110 + lVar73 + lVar87 + LStack_2e0 * 2];
            if (((0 < *(int *)((long)local_2b8 +
                              ((lVar86 - local_298._4_4_) * lStack_2b0 +
                              (lVar62 - (int)local_298) + (lVar85 - iStack_290) * local_2a8) * 4))
                && (local_470.vect[0] = iVar75, local_470.vect[1] = iVar79,
                   local_470.vect[2] = iVar69,
                   bVar59 = amrex::Box::contains((Box *)&local_278,&local_470), bVar59)) &&
               (local_464.vect[0] = iVar75, local_464.vect[1] = iVar79, local_464.vect[2] = iVar69,
               bVar59 = amrex::Box::contains((Box *)(auStack_260 + 4),&local_464), bVar59)) {
              lVar73 = (long)(iVar75 - (int)local_2d8);
              lVar110 = (iVar79 - local_2d8._4_4_) * lStack_2f0;
              lVar87 = (iVar69 - iStack_2d0) * local_2e8;
              pdVar74 = (double *)
                        ((lVar86 - local_220._4_4_) * LStack_238 * 8 +
                         CONCAT44(uStack_23c,local_240) + (lVar62 - (int)local_220) * 8 +
                        (lVar85 - iStack_218) * local_230 * 8);
              lVar88 = (long)(iVar75 - (int)local_358);
              lVar64 = (iVar79 - local_358._4_4_) * LStack_370;
              lVar65 = (iVar69 - iStack_350) * local_368;
              lVar66 = (lVar86 - local_318._4_4_) * lStack_330;
              lVar82 = (lVar85 - iStack_310) * local_328;
              local_338[lVar66 + (lVar62 - (int)local_318) + lVar82] =
                   local_2f8[lVar110 + lVar73 + lVar87] * *pdVar74 *
                   local_378[lVar64 + lVar88 + lVar65];
              pdVar76 = local_338 + lVar66 + (lVar62 - (int)local_318) + lVar82;
              pdVar76[LStack_320] =
                   local_2f8[lVar110 + lVar73 + lVar87 + LStack_2e0] * *pdVar74 *
                   local_378[lVar64 + lVar88 + lVar65];
              pdVar76[LStack_320 * 2] =
                   local_2f8[lVar110 + lVar73 + lVar87 + LStack_2e0 * 2] * *pdVar74 *
                   local_378[lVar64 + lVar88 + lVar65];
              uVar71 = *(uint *)((long)local_2b8 +
                                ((lVar86 - local_298._4_4_) * lStack_2b0 +
                                (lVar62 - (int)local_298) + (lVar85 - iStack_290) * local_2a8) * 4);
              if ((int)*(uint *)((long)local_2b8 +
                                ((lVar86 - local_298._4_4_) * lStack_2b0 +
                                (lVar62 - (int)local_298) + (lVar85 - iStack_290) * local_2a8) * 4)
                  < 1) {
                uVar71 = 0;
              }
              uVar80 = (ulong)uVar71;
              piVar77 = (int *)((long)local_2b8 +
                               ((lVar62 + LStack_2a0 +
                                          (lVar72 - iStack_290) * local_2a8 +
                                          (lVar63 - local_298._4_4_) * lStack_2b0) -
                               (long)(int)local_298) * 4);
              while (bVar59 = uVar80 != 0, uVar80 = uVar80 - 1, bVar59) {
                lVar110 = (long)*piVar77;
                iVar69 = *(int *)((long)&local_198 + lVar110 * 4 + 4);
                iVar99 = local_200[lVar110] + iVar75;
                iVar106 = iVar69 + iVar79;
                iVar70 = local_128[lVar110];
                iVar109 = (int)local_448 + iVar70;
                pdVar96 = local_2f8 +
                          (iVar106 - local_2d8._4_4_) * lStack_2f0 +
                          (long)(iVar99 - (int)local_2d8) + (iVar109 - iStack_2d0) * local_2e8;
                lVar73 = (long)(iVar99 - (int)local_358);
                lVar88 = (iVar106 - local_358._4_4_) * LStack_370;
                lVar72 = CONCAT44(uStack_b4,local_b8) +
                         ((long)iVar106 - (long)local_98._4_4_) * LStack_b0 * 8 +
                         ((long)iVar99 - (long)(int)local_98) * 8;
                lVar64 = (iVar109 - iStack_350) * local_368;
                lVar87 = ((long)iVar109 - (long)local_90) * local_a8;
                *pdVar76 = (((double)local_200[lVar110] + *pdVar96) * pdVar74[LStack_228] *
                           local_378[lVar88 + lVar73 + lVar64]) / *(double *)(lVar72 + lVar87 * 8) +
                           *pdVar76;
                pdVar76[LStack_320] =
                     (((double)iVar69 + pdVar96[LStack_2e0]) * pdVar74[LStack_228] *
                     local_378[lVar88 + lVar73 + lVar64]) / *(double *)(lVar72 + lVar87 * 8) +
                     pdVar76[LStack_320];
                pdVar76[LStack_320 * 2] =
                     (((double)iVar70 + pdVar96[LStack_2e0 * 2]) * pdVar74[LStack_228] *
                     local_378[lVar88 + lVar73 + lVar64]) / *(double *)(lVar72 + lVar87 * 8) +
                     pdVar76[LStack_320 * 2];
                piVar77 = piVar77 + LStack_2a0;
              }
              lVar62 = lVar62 - (int)local_58;
              lVar86 = (lVar86 - local_58._4_4_) * LStack_70;
              lVar72 = (lVar85 - iStack_50) * local_68;
              *pdVar76 = *pdVar76 / local_78[lVar86 + lVar62 + lVar72];
              pdVar76[LStack_320] = pdVar76[LStack_320] / local_78[lVar86 + lVar62 + lVar72];
              pdVar76[LStack_320 * 2] = pdVar76[LStack_320 * 2] / local_78[lVar86 + lVar62 + lVar72]
              ;
              lVar72 = local_448;
            }
          }
          bVar59 = iVar75 != iVar61;
          iVar75 = iVar75 + 1;
        } while (bVar59);
      }
      lVar63 = lVar63 + 1;
    }
  }
  return;
}

Assistant:

void
Redistribution::MakeStateRedistUtils ( Box const& bx,
                                       Array4<EBCellFlag const> const& flag,
                                       Array4<Real const> const& vfrac,
                                       Array4<Real const> const& ccent,
                                       Array4<int  const> const& itracker,
                                       Array4<Real      > const& nrs,
                                       Array4<Real      > const& alpha,
                                       Array4<Real      > const& nbhd_vol,
                                       Array4<Real      > const& cent_hat,
                                       Geometry const& lev_geom,
                                       Real target_vol)
{
    // Note that itracker has {4 in 2D, 8 in 3D} components and all are initialized to zero
    // We will add to the first component every time this cell is included in a merged neighborhood,
    //    either by merging or being merged
    //
    // In 2D, we identify the cells in the remaining three components with the following ordering
    //
    // ^  6 7 8
    // |  4   5
    // j  1 2 3
    //   i --->
    //
    // In 3D, We identify the cells in the remaining three components with the following ordering
    //
    //    at k-1   |   at k  |   at k+1
    //
    // ^  15 16 17 |  6 7 8  |  24 25 26
    // |  12 13 14 |  4   5  |  21 22 23
    // j  9  10 11 |  1 2 3  |  18 19 20
    //   i --->
    //
    // Note the first component of each of these arrays should never be used
    //
#if (AMREX_SPACEDIM == 2)
    Array<int,9> imap{0,-1, 0, 1,-1, 1,-1, 0, 1};
    Array<int,9> jmap{0,-1,-1,-1, 0, 0, 1, 1, 1};
    Array<int,9> kmap{0, 0, 0, 0, 0, 0, 0, 0, 0};
#else
    Array<int,27>    imap{0,-1, 0, 1,-1, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1};
    Array<int,27>    jmap{0,-1,-1,-1, 0, 0, 1, 1, 1,-1,-1,-1, 0, 0, 0, 1, 1, 1,-1,-1,-1, 0, 0, 0, 1, 1, 1};
    Array<int,27>    kmap{0, 0, 0, 0, 0, 0, 0, 0, 0,-1,-1,-1,-1,-1,-1,-1,-1,-1, 1, 1, 1, 1, 1, 1, 1, 1, 1};
#endif

    AMREX_D_TERM(const auto& is_periodic_x = lev_geom.isPeriodic(0);,
                 const auto& is_periodic_y = lev_geom.isPeriodic(1);,
                 const auto& is_periodic_z = lev_geom.isPeriodic(2););

    Box const& bxg2 = amrex::grow(bx,2);
    Box const& bxg3 = amrex::grow(bx,3);
    Box const& bxg4 = amrex::grow(bx,4);

    const Box domain = lev_geom.Domain();

    Box domain_per_grown = domain;
    if (is_periodic_x) domain_per_grown.grow(0,2);
    if (is_periodic_y) domain_per_grown.grow(1,2);
#if (AMREX_SPACEDIM == 3)
    if (is_periodic_z) domain_per_grown.grow(2,2);
#endif

    amrex::ParallelFor(bxg3,
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        // Everyone is in their own neighborhood at least
        nrs(i,j,k) = 1.;
        alpha(i,j,k,0) = 1.;
        alpha(i,j,k,1) = 1.;
    });

    // nrs captures how many neighborhoods (r,s) is in
    amrex::ParallelFor(bxg4,
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        // This loops over the neighbors of (i,j,k), and doesn't include (i,j,k) itself
        for (int i_nbor = 1; i_nbor <= itracker(i,j,k,0); i_nbor++)
        {
            int r = i+imap[itracker(i,j,k,i_nbor)];
            int s = j+jmap[itracker(i,j,k,i_nbor)];
            int t = k+kmap[itracker(i,j,k,i_nbor)];
            if ( domain_per_grown.contains(IntVect(AMREX_D_DECL(r,s,t))) &&
                 bxg3.contains(IntVect(AMREX_D_DECL(r,s,t))) )
            {
                amrex::Gpu::Atomic::Add(&nrs(r,s,t),1.0_rt);
            }
        }
    });

    amrex::ParallelFor(bxg2,
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        if (!flag(i,j,k).isCovered())
        {
            // Start with the vfrac of (i,j,k)
            nbhd_vol(i,j,k) = vfrac(i,j,k) / nrs(i,j,k);
            Real vol_of_nbors = 0.;

            // This loops over the neighbors of (i,j,k), and doesn't include (i,j,k) itself
            for (int i_nbor = 1; i_nbor <= itracker(i,j,k,0); i_nbor++)
            {
                int r = i+imap[itracker(i,j,k,i_nbor)];
                int s = j+jmap[itracker(i,j,k,i_nbor)];
                int t = k+kmap[itracker(i,j,k,i_nbor)];
                amrex::Gpu::Atomic::Add(&nbhd_vol(i,j,k),vfrac(r,s,t) / nrs(r,s,t));
                vol_of_nbors += vfrac(r,s,t);
            }

            if (itracker(i,j,k,0) > 0)
                alpha(i,j,k,1) = (target_vol - vfrac(i,j,k)) / vol_of_nbors;

        } else {
            nbhd_vol(i,j,k) = 0.;
            alpha(i,j,k,0) = 0.;
            alpha(i,j,k,1) = 0.;
        }
    });

    // Define how much each cell keeps
    amrex::ParallelFor(bxg2,
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        if (!flag(i,j,k).isCovered())
        {
            // This loops over the neighbors of (i,j,k), and doesn't include (i,j,k) itself
            for (int i_nbor = 1; i_nbor <= itracker(i,j,k,0); i_nbor++)
            {
                int r = i+imap[itracker(i,j,k,i_nbor)];
                int s = j+jmap[itracker(i,j,k,i_nbor)];
                int t = k+kmap[itracker(i,j,k,i_nbor)];
                amrex::Gpu::Atomic::Add(&alpha(r,s,t,0),-(alpha(i,j,k,1)/nrs(r,s,t)));
            }
        }
    });

    // Redefine nbhd_vol
    amrex::ParallelFor(bxg2,
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        if (!flag(i,j,k).isCovered())
        {
            nbhd_vol(i,j,k)  = alpha(i,j,k,0) * vfrac(i,j,k);

            // This loops over the neighbors of (i,j,k), and doesn't include (i,j,k) itself
            for (int i_nbor = 1; i_nbor <= itracker(i,j,k,0); i_nbor++)
            {
                int r = i+imap[itracker(i,j,k,i_nbor)];
                int s = j+jmap[itracker(i,j,k,i_nbor)];
                int t = k+kmap[itracker(i,j,k,i_nbor)];
                amrex::Gpu::Atomic::Add(&nbhd_vol(i,j,k),alpha(i,j,k,1) * vfrac(r,s,t) / nrs(r,s,t));
            }
        }
    });

    // Define xhat,yhat,zhat (from Berger and Guliani)
    amrex::ParallelFor(bxg3,
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        if (vfrac(i,j,k) > 0.0)
        {
            AMREX_D_TERM(cent_hat(i,j,k,0) = ccent(i,j,k,0);,
                         cent_hat(i,j,k,1) = ccent(i,j,k,1);,
                         cent_hat(i,j,k,2) = ccent(i,j,k,2););

            if ( itracker(i,j,k,0) > 0 &&
                 domain_per_grown.contains(IntVect(AMREX_D_DECL(i,j,k))) &&
                             bxg2.contains(IntVect(AMREX_D_DECL(i,j,k))) ) {

                AMREX_D_TERM(cent_hat(i,j,k,0) = ccent(i,j,k,0) * alpha(i,j,k,0) *vfrac(i,j,k);,
                             cent_hat(i,j,k,1) = ccent(i,j,k,1) * alpha(i,j,k,0) *vfrac(i,j,k);,
                             cent_hat(i,j,k,2) = ccent(i,j,k,2) * alpha(i,j,k,0) *vfrac(i,j,k););

                // This loops over the neighbors of (i,j,k), and doesn't include (i,j,k) itself
                for (int i_nbor = 1; i_nbor <= itracker(i,j,k,0); i_nbor++)
                {
                    int ii = imap[itracker(i,j,k,i_nbor)]; int r = i+ii;
                    int jj = jmap[itracker(i,j,k,i_nbor)]; int s = j+jj;
                    int kk = kmap[itracker(i,j,k,i_nbor)]; int t = k+kk;

                    AMREX_D_TERM(cent_hat(i,j,k,0) += (ccent(r,s,t,0) + ii) * alpha(i,j,k,1) * vfrac(r,s,t) / nrs(r,s,t);,
                                 cent_hat(i,j,k,1) += (ccent(r,s,t,1) + jj) * alpha(i,j,k,1) * vfrac(r,s,t) / nrs(r,s,t);,
                                 cent_hat(i,j,k,2) += (ccent(r,s,t,2) + kk) * alpha(i,j,k,1) * vfrac(r,s,t) / nrs(r,s,t););
                }

                AMREX_D_TERM(cent_hat(i,j,k,0) /= nbhd_vol(i,j,k);,
                             cent_hat(i,j,k,1) /= nbhd_vol(i,j,k);,
                             cent_hat(i,j,k,2) /= nbhd_vol(i,j,k););
            }
        } else {

                AMREX_D_TERM(cent_hat(i,j,k,0) = 1.e40;,
                             cent_hat(i,j,k,1) = 1.e40;,
                             cent_hat(i,j,k,2) = 1.e40;);
        }
    });
}